

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::setVisible(QFontDialogPrivate *this,bool visible)

{
  ulong uVar1;
  long *in_RDI;
  bool in_stack_0000000f;
  QDialog *q;
  bool in_stack_00000037;
  QDialogPrivate *in_stack_00000038;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  
  uVar1 = (**(code **)(*in_RDI + 0xa8))();
  if ((uVar1 & 1) != 0) {
    QDialogPrivate::setNativeDialogVisible((QDialogPrivate *)q,in_stack_0000000f);
  }
  if ((*(byte *)(in_RDI + 0x59) & 1) == 0) {
    QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  }
  else {
    QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  }
  QDialogPrivate::setVisible(in_stack_00000038,in_stack_00000037);
  return;
}

Assistant:

void QFontDialogPrivate::setVisible(bool visible)
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const auto q = static_cast<QDialog *>(q_ptr);

    if (canBeNativeDialog())
        setNativeDialogVisible(visible);
    if (nativeDialogInUse) {
        // Set WA_DontShowOnScreen so that QDialog::setVisible(visible) below
        // updates the state correctly, but skips showing the non-native version:
        q->setAttribute(Qt::WA_DontShowOnScreen, true);
    } else {
        q->setAttribute(Qt::WA_DontShowOnScreen, false);
    }
    QDialogPrivate::setVisible(visible);
}